

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

void llb_build_key_get_filtered_directory_filters
               (llb_build_key_t *key,void *context,IteratorFunction iterator)

{
  llb_data_t lVar1;
  pointer pSVar2;
  llb_data_t data;
  StringRef filter;
  StringList filters;
  llb_data_t local_98;
  StringRef local_88;
  StringList local_78;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_68;
  string local_50;
  
  llbuild::buildsystem::BuildKey::getContentExclusionPatternsAsStringList((BuildKey *)&local_78);
  llbuild::basic::StringList::getValues
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_68,&local_78);
  for (pSVar2 = local_68._M_impl.super__Vector_impl_data._M_start;
      pSVar2 != local_68._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    local_88.Data = pSVar2->Data;
    local_98.length = pSVar2->Length;
    local_88.Length = local_98.length;
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_88);
    local_98.data = (uint8_t *)strdup(local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    lVar1.data = local_98.data;
    lVar1.length = local_98.length;
    (*iterator)(context,lVar1);
    llb_data_destroy(&local_98);
  }
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_68);
  llbuild::basic::StringList::~StringList(&local_78);
  return;
}

Assistant:

void llb_build_key_get_filtered_directory_filters(llb_build_key_t *key, void *context, IteratorFunction iterator) {
  auto filters = ((CAPIBuildKey *)key)->getInternalBuildKey().getContentExclusionPatternsAsStringList();
  for (auto filter: filters.getValues()) {
    llb_data_t data;
    data.length = filter.size();
    data.data = (const uint8_t*)strdup(filter.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}